

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O0

void fl_rectbound(int x,int y,int w,int h,Fl_Color bgcolor)

{
  Fl_Color bgcolor_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  Fl::set_box_color(0x38);
  fl_rect(x,y,w,h);
  Fl::set_box_color(bgcolor);
  fl_rectf(x + 1,y + 1,w + -2,h + -2);
  return;
}

Assistant:

void fl_rectbound(int x, int y, int w, int h, Fl_Color bgcolor) {
  Fl::set_box_color(FL_BLACK);
  fl_rect(x, y, w, h);
  Fl::set_box_color(bgcolor);
  fl_rectf(x+1, y+1, w-2, h-2);
}